

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.c
# Opt level: O0

void BrotliInitEncoderDictionary(BrotliEncoderDictionary *dict)

{
  BrotliDictionary *pBVar1;
  BrotliEncoderDictionary *dict_local;
  
  pBVar1 = (BrotliDictionary *)BrotliGetDictionary();
  dict->words = pBVar1;
  dict->hash_table = kStaticDictionaryHash;
  dict->buckets = kStaticDictionaryBuckets;
  dict->dict_words = kStaticDictionaryWords;
  dict->cutoffTransformsCount = 10;
  dict->cutoffTransforms = 0x71b520ada2d3200;
  return;
}

Assistant:

void BrotliInitEncoderDictionary(BrotliEncoderDictionary* dict) {
  dict->words = BrotliGetDictionary();

  dict->hash_table = kStaticDictionaryHash;
  dict->buckets = kStaticDictionaryBuckets;
  dict->dict_words = kStaticDictionaryWords;

  dict->cutoffTransformsCount = kCutoffTransformsCount;
  dict->cutoffTransforms = kCutoffTransforms;

}